

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImRect __thiscall ImGuiWindow::TitleBarRect(ImGuiWindow *this)

{
  ImVec2 IVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  ImRect IVar4;
  float local_28;
  float fStack_24;
  undefined1 extraout_var [60];
  
  auVar2._0_4_ = (this->SizeFull).x;
  auVar2._4_4_ = (this->SizeFull).y;
  auVar2._8_4_ = (this->ContentSize).x;
  auVar2._12_4_ = (this->ContentSize).y;
  IVar1 = this->Pos;
  auVar3._0_4_ = TitleBarHeight(this);
  auVar3._4_60_ = extraout_var;
  auVar2 = vinsertps_avx(auVar2,auVar3._0_16_,0x10);
  local_28 = IVar1.x;
  fStack_24 = IVar1.y;
  IVar4.Max.x = auVar2._0_4_ + local_28;
  IVar4.Max.y = auVar2._4_4_ + fStack_24;
  IVar4.Min = this->Pos;
  return IVar4;
}

Assistant:

ImRect      TitleBarRect() const        { return ImRect(Pos, ImVec2(Pos.x + SizeFull.x, Pos.y + TitleBarHeight())); }